

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

void __thiscall ArgumentParser::Instance::FinishKeyword(Instance *this)

{
  ParseResult *this_00;
  string_view key;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  bool bVar1;
  string_view local_30;
  size_t local_20;
  char *local_18;
  Instance *local_10;
  Instance *this_local;
  
  local_10 = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&this->Keyword);
  if ((!bVar1) && (this->KeywordValuesSeen < this->KeywordValuesExpected)) {
    if (this->ParseResults != (ParseResult *)0x0) {
      this_00 = this->ParseResults;
      local_20 = (this->Keyword)._M_len;
      local_18 = (this->Keyword)._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_30,"  missing required value\n");
      key._M_str = local_18;
      key._M_len = local_20;
      ParseResult::AddKeywordError(this_00,key,local_30);
    }
    bVar1 = std::function::operator_cast_to_bool((function *)&this->Bindings->KeywordMissingValue);
    if (bVar1) {
      __args_1._M_len = (this->Keyword)._M_len;
      __args_1._M_str = (this->Keyword)._M_str;
      std::
      function<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()(&this->Bindings->KeywordMissingValue,this,__args_1);
    }
  }
  return;
}

Assistant:

void Instance::FinishKeyword()
{
  if (this->Keyword.empty()) {
    return;
  }
  if (this->KeywordValuesSeen < this->KeywordValuesExpected) {
    if (this->ParseResults != nullptr) {
      this->ParseResults->AddKeywordError(this->Keyword,
                                          "  missing required value\n");
    }
    if (this->Bindings.KeywordMissingValue) {
      this->Bindings.KeywordMissingValue(*this, this->Keyword);
    }
  }
}